

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O1

qint64 __thiscall
QUdpSocket::readDatagram
          (QUdpSocket *this,char *data,qint64 maxSize,QHostAddress *address,quint16 *port)

{
  QAbstractSocketPrivate *this_00;
  bool bVar1;
  SocketError errorCode;
  long lVar2;
  long in_FS_OFFSET;
  QIpPacketHeader header;
  QHostAddress local_70;
  QString local_68;
  undefined8 uStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&(this->super_QAbstractSocket).field_0x8;
  bVar1 = QAbstractSocket::isValid(&this->super_QAbstractSocket);
  if (bVar1) {
    if (address == (QHostAddress *)0x0 && port == (quint16 *)0x0) {
      lVar2 = (**(code **)(*(long *)this_00->socketEngine + 0xf8))
                        (this_00->socketEngine,data,maxSize,0,0);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress::QHostAddress(&local_70);
      QHostAddress::QHostAddress((QHostAddress *)&local_68);
      QHostAddress::QHostAddress((QHostAddress *)&local_68.d.ptr,&local_70);
      local_68.d.size = -0x100000000;
      uStack_50 = (undefined1 *)0xffffffff;
      local_48 = (undefined1 *)((ulong)local_48 & 0xffffffffffffff00);
      QHostAddress::~QHostAddress(&local_70);
      lVar2 = (**(code **)(*(long *)this_00->socketEngine + 0xf8))
                        (this_00->socketEngine,data,maxSize,&local_68,1);
      if (address != (QHostAddress *)0x0) {
        QHostAddress::operator=(address,(QHostAddress *)&local_68);
      }
      if (port != (quint16 *)0x0) {
        *port = uStack_50._4_2_;
      }
      QHostAddress::~QHostAddress((QHostAddress *)&local_68.d.ptr);
      QHostAddress::~QHostAddress((QHostAddress *)&local_68);
    }
    this_00->hasPendingData = false;
    this_00->hasPendingDatagram = false;
    (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
    if (-1 < lVar2) goto LAB_001cab60;
    if (lVar2 != -2) {
      errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketEngine::errorString(&local_68,(QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketPrivate::setErrorAndEmit(this_00,errorCode,&local_68);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_001cab60;
    }
    QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,0x26701f);
    QAbstractSocketPrivate::setErrorAndEmit(this_00,TemporaryError,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    readDatagram();
  }
  lVar2 = -1;
LAB_001cab60:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUdpSocket::readDatagram(char *data, qint64 maxSize, QHostAddress *address,
                                    quint16 *port)
{
    Q_D(QUdpSocket);

#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::readDatagram(%p, %llu, %p, %p)", data, maxSize, address, port);
#endif
    QT_CHECK_BOUND("QUdpSocket::readDatagram()", -1);

    qint64 readBytes;
    if (address || port) {
        QIpPacketHeader header;
        readBytes = d->socketEngine->readDatagram(data, maxSize, &header,
                                                  QAbstractSocketEngine::WantDatagramSender);
        if (address)
            *address = header.senderAddress;
        if (port)
            *port = header.senderPort;
    } else {
        readBytes = d->socketEngine->readDatagram(data, maxSize);
    }

    d->hasPendingData = false;
    d->hasPendingDatagram = false;
    d->socketEngine->setReadNotificationEnabled(true);
    if (readBytes < 0) {
        if (readBytes == -2) {
            // No pending datagram. Treat as a temporary error.
            d->setErrorAndEmit(QAbstractSocket::TemporaryError,
                               tr("No datagram available for reading"));
            return -1;
        }
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return readBytes;
}